

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v5::internal::sprintf_format<long_double>
               (longdouble value,buffer *buf,core_format_specs spec)

{
  bool bVar1;
  int iVar2;
  type tVar3;
  size_t sVar4;
  char *format_00;
  size_t sVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  core_format_specs in_RSI;
  basic_buffer<char> *in_RDI;
  unkbyte10 in_stack_00000008;
  uint n;
  int result;
  size_t buffer_size;
  char *start;
  char *format_ptr;
  char format [10];
  undefined2 uVar8;
  undefined6 in_stack_ffffffffffffff92;
  basic_buffer<char> *in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa8;
  undefined1 uVar9;
  char *in_stack_ffffffffffffffd0;
  core_format_specs local_8;
  
  puVar7 = &stack0xffffffffffffffd7;
  uVar9 = 0x25;
  local_8 = in_RSI;
  bVar1 = core_format_specs::has(&local_8,8);
  if (bVar1) {
    puVar6 = puVar7 + 1;
    *puVar7 = 0x23;
    puVar7 = puVar6;
  }
  if (-1 < local_8.precision) {
    puVar6 = puVar7 + 1;
    *puVar7 = 0x2e;
    puVar7 = puVar7 + 2;
    *puVar6 = 0x2a;
  }
  *puVar7 = 0x4c;
  puVar6 = puVar7 + 2;
  puVar7[1] = local_8.type;
  *puVar6 = 0;
  while( true ) {
    while( true ) {
      sVar4 = basic_buffer<char>::capacity(in_RDI);
      iVar2 = (int)(sVar4 >> 0x20);
      format_00 = basic_buffer<char>::operator[](in_RDI,0);
      sVar4 = (size_t)in_stack_00000008;
      uVar8 = (undefined2)((unkuint10)in_stack_00000008 >> 0x40);
      iVar2 = char_traits<char>::format_float<long_double>
                        (in_stack_ffffffffffffffd0,(size_t)puVar6,format_00,iVar2,
                         (longdouble)CONCAT28(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0));
      if (-1 < iVar2) break;
      in_stack_ffffffffffffffa0 = in_RDI;
      basic_buffer<char>::capacity(in_RDI);
      basic_buffer<char>::reserve
                ((basic_buffer<char> *)CONCAT62(in_stack_ffffffffffffff92,uVar8),sVar4);
    }
    tVar3 = to_unsigned<int>(iVar2);
    in_stack_ffffffffffffffa8 = (undefined2)tVar3;
    sVar5 = basic_buffer<char>::capacity(in_RDI);
    if (CONCAT22((short)(tVar3 >> 0x10),in_stack_ffffffffffffffa8) < sVar5) break;
    basic_buffer<char>::reserve
              ((basic_buffer<char> *)CONCAT62(in_stack_ffffffffffffff92,uVar8),sVar4);
  }
  basic_buffer<char>::resize((basic_buffer<char> *)CONCAT62(in_stack_ffffffffffffff92,uVar8),sVar4);
  return;
}

Assistant:

void sprintf_format(Double value, internal::buffer &buf,
                    core_format_specs spec) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() != 0, "empty buffer");

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  char format[MAX_FORMAT_SIZE];
  char *format_ptr = format;
  *format_ptr++ = '%';
  if (spec.has(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<Double, long double>::value)
    *format_ptr++ = 'L';
  *format_ptr++ = spec.type;
  *format_ptr = '\0';

  // Format using snprintf.
  char *start = FMT_NULL;
  for (;;) {
    std::size_t buffer_size = buf.capacity();
    start = &buf[0];
    int result = internal::char_traits<char>::format_float(
        start, buffer_size, format, spec.precision, value);
    if (result >= 0) {
      unsigned n = internal::to_unsigned(result);
      if (n < buf.capacity()) {
        buf.resize(n);
        break;  // The buffer is large enough - continue with formatting.
      }
      buf.reserve(n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buf.reserve(buf.capacity() + 1);
    }
  }
}